

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O2

Fraction operator*(Fraction *a,int *b)

{
  Fraction current_frac;
  Fraction local_10;
  
  local_10.denominator_ = (*a).denominator_;
  local_10.numerator_ = (*a).numerator_ * *b;
  Fraction::Normalization(&local_10);
  return local_10;
}

Assistant:

Fraction operator*(const Fraction& a, const int& b) {
  Fraction current_frac = a;
  current_frac.numerator_ *= b;
  current_frac.Normalization();
  return current_frac;
}